

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::Encode(GroupAssignmentRecord *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GroupAssignmentRecord *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui32GrpBtField);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_Entity);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16DstCommsDvcID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8DstLineID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  KDataStream::operator<<(pKVar1,this->m_ui8Padding2);
  return;
}

Assistant:

void GroupAssignmentRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32GrpBtField
           << KDIS_STREAM m_Entity
           << m_ui16DstCommsDvcID
           << m_ui8DstLineID
           << m_ui16Padding1
           << m_ui8Padding2;
}